

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall Catch::Config::readBazelEnvVars(Config *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  pointer pcVar1;
  char cVar2;
  char *pcVar3;
  size_t sVar4;
  char *__s;
  char *__s_00;
  Optional<Catch::(anonymous_namespace)::bazelShardingOptions> bazelShardOptions;
  Optional<unsigned_int> shardIndex;
  Optional<unsigned_int> shardTotal;
  ofstream f;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_300;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f0;
  char local_2e0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_2d8;
  undefined4 *local_2d0 [2];
  undefined1 local_2c0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  string local_298;
  Optional<Catch::ColourMode> local_278;
  undefined4 *local_268 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_258;
  undefined1 local_228 [8];
  char *local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_208;
  ColourMode *local_1e0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1d0 [3];
  ios_base local_130 [264];
  
  pcVar3 = getenv("XML_OUTPUT_FILE");
  if (pcVar3 != (char *)0x0) {
    local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"junit","");
    local_300 = &local_2f0;
    sVar4 = strlen(pcVar3);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,pcVar3,pcVar3 + sVar4);
    local_2c0 = (undefined1  [8])&local_2b8;
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    if (local_300 == &local_2f0) {
      local_2b8.field_2._8_8_ = local_2f0._8_8_;
    }
    else {
      local_2b8._M_dataplus._M_p = (pointer)local_300;
    }
    local_2b8._M_string_length = (size_type)local_2f8;
    local_2f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
    local_2f0._M_allocated_capacity = local_2f0._M_allocated_capacity & 0xffffffffffffff00;
    local_278.nullableValue = (ColourMode *)0x0;
    local_258._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_258._M_impl.super__Rb_tree_header._M_header;
    local_258._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_258._M_impl._0_8_ = 0;
    local_258._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_258._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_258._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_300 = &local_2f0;
    local_258._M_impl.super__Rb_tree_header._M_header._M_right =
         local_258._M_impl.super__Rb_tree_header._M_header._M_left;
    ReporterSpec::ReporterSpec
              ((ReporterSpec *)local_228,&local_298,
               (Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_2c0,&local_278,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&local_258);
    std::vector<Catch::ReporterSpec,_std::allocator<Catch::ReporterSpec>_>::
    emplace_back<Catch::ReporterSpec>
              (&(this->m_data).reporterSpecifications,(ReporterSpec *)local_228);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(local_1d0);
    local_1e0 = (ColourMode *)0x0;
    if (pbStack_208 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = (pbStack_208->_M_dataplus)._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar1 != &pbStack_208->field_2) {
        operator_delete(pcVar1,(pbStack_208->field_2)._M_allocated_capacity + 1);
      }
    }
    pbStack_208 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (local_228 != (undefined1  [8])&local_218) {
      operator_delete((void *)local_228,local_218._M_allocated_capacity + 1);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_258);
    local_278.nullableValue = (ColourMode *)0x0;
    if (local_2c0 != (undefined1  [8])0x0) {
      pcVar1 = ((_Alloc_hider *)local_2c0)->_M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar1 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)((long)local_2c0 + 0x10)) {
        operator_delete(pcVar1,((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)((long)local_2c0 + 0x10))->_M_allocated_capacity + 1);
      }
    }
    local_2c0 = (undefined1  [8])0x0;
    if (local_300 != &local_2f0) {
      operator_delete(local_300,(ulong)(local_2f0._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != &local_298.field_2) {
      operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
    }
  }
  pcVar3 = getenv("TESTBRIDGE_TEST_ONLY");
  if (pcVar3 != (char *)0x0) {
    this_00 = &(this->m_data).testsOrTags;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase_at_end(this_00,(this->m_data).testsOrTags.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
    local_228 = (undefined1  [8])&local_218;
    sVar4 = strlen(pcVar3);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_228,pcVar3,pcVar3 + sVar4);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228);
    if (local_228 != (undefined1  [8])&local_218) {
      operator_delete((void *)local_228,local_218._M_allocated_capacity + 1);
    }
  }
  pcVar3 = getenv("TEST_SHARD_INDEX");
  __s = getenv("TEST_TOTAL_SHARDS");
  __s_00 = getenv("TEST_SHARD_STATUS_FILE");
  if (((pcVar3 == (char *)0x0) || (__s == (char *)0x0)) || (__s_00 == (char *)0x0)) {
    if (pcVar3 == (char *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Warning: Bazel shard configuration is missing \'",0x2f);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"TEST_SHARD_INDEX",0x10);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"\'. Shard configuration is skipped.\n",0x23);
    }
    if (__s == (char *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Warning: Bazel shard configuration is missing \'",0x2f);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"TEST_TOTAL_SHARDS",0x11);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"\'. Shard configuration is skipped.\n",0x23);
    }
    if (__s_00 == (char *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Warning: Bazel shard configuration is missing \'",0x2f);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"TEST_SHARD_STATUS_FILE",0x16);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"\'. Shard configuration is skipped.\n",0x23);
    }
  }
  else {
    local_228 = (undefined1  [8])&local_218;
    sVar4 = strlen(pcVar3);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_228,pcVar3,pcVar3 + sVar4);
    parseUInt((Catch *)local_2d0,(string *)local_228,10);
    if (local_228 != (undefined1  [8])&local_218) {
      operator_delete((void *)local_228,local_218._M_allocated_capacity + 1);
    }
    if (local_2d0[0] == (undefined4 *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Warning: could not parse \'TEST_SHARD_INDEX\' (\'",0x2e);
      sVar4 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar3,sVar4);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"\') as unsigned int.\n",0x14);
    }
    else {
      local_228 = (undefined1  [8])&local_218;
      sVar4 = strlen(__s);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_228,__s,__s + sVar4);
      parseUInt((Catch *)local_268,(string *)local_228,10);
      if (local_228 != (undefined1  [8])&local_218) {
        operator_delete((void *)local_228,local_218._M_allocated_capacity + 1);
      }
      if (local_268[0] != (undefined4 *)0x0) {
        if (local_2d0[0] == (undefined4 *)0x0) {
          __assert_fail("nullableValue",
                        "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.hpp"
                        ,0xe93,"T &Catch::Optional<unsigned int>::operator*() [T = unsigned int]");
        }
        local_228._4_4_ = *local_268[0];
        local_228._0_4_ = *local_2d0[0];
        local_220 = local_218._M_local_buf + 8;
        sVar4 = strlen(__s_00);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,__s_00,__s_00 + sVar4);
        local_300 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)&local_2f8;
        local_2f8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_228;
        local_2f0._M_allocated_capacity = (size_type)local_2e0;
        if (local_220 == local_218._M_local_buf + 8) {
          pbStack_2d8 = pbStack_208;
        }
        else {
          local_2f0._M_allocated_capacity = (size_type)local_220;
        }
        goto LAB_00143043;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Warning: could not parse \'TEST_TOTAL_SHARD\' (\'",0x2e);
      sVar4 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,__s,sVar4);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"\') as unsigned int.\n",0x14);
    }
  }
  local_300 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0;
LAB_00143043:
  if (local_300 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    std::ofstream::ofstream(local_228,(string *)((long)local_300 + 8),_S_trunc|_S_out);
    cVar2 = std::__basic_file<char>::is_open();
    if (cVar2 != '\0') {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,"",0);
      if (local_300 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        __assert_fail("nullableValue",
                      "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.hpp"
                      ,0xe9f,
                      "const T *Catch::Optional<Catch::(anonymous namespace)::bazelShardingOptions>::operator->() const [T = Catch::(anonymous namespace)::bazelShardingOptions]"
                     );
      }
      (this->m_data).shardIndex = *(uint *)local_300;
      (this->m_data).shardCount = *(uint *)((long)local_300 + 4);
    }
    local_228 = (undefined1  [8])_VTT;
    *(undefined8 *)(local_228 + *(long *)(_VTT->_M_local_buf + -0x18)) = _setBool;
    std::filebuf::~filebuf((filebuf *)&local_220);
    std::ios_base::~ios_base(local_130);
  }
  if (local_300 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    if (*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          **)((long)local_300 + 8) !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)((long)local_300 + 0x18)) {
      operator_delete(*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        **)((long)local_300 + 8),
                      ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)((long)local_300 + 0x18))->_M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void Config::readBazelEnvVars() {
        // Register a JUnit reporter for Bazel. Bazel sets an environment
        // variable with the path to XML output. If this file is written to
        // during test, Bazel will not generate a default XML output.
        // This allows the XML output file to contain higher level of detail
        // than what is possible otherwise.
        const auto bazelOutputFile = Detail::getEnv( "XML_OUTPUT_FILE" );

        if ( bazelOutputFile ) {
            m_data.reporterSpecifications.push_back(
                { "junit", std::string( bazelOutputFile ), {}, {} } );
        }

        const auto bazelTestSpec = Detail::getEnv( "TESTBRIDGE_TEST_ONLY" );
        if ( bazelTestSpec ) {
            // Presumably the test spec from environment should overwrite
            // the one we got from CLI (if we got any)
            m_data.testsOrTags.clear();
            m_data.testsOrTags.push_back( bazelTestSpec );
        }

        const auto bazelShardOptions = readBazelShardingOptions();
        if ( bazelShardOptions ) {
            std::ofstream f( bazelShardOptions->shardFilePath,
                             std::ios_base::out | std::ios_base::trunc );
            if ( f.is_open() ) {
                f << "";
                m_data.shardIndex = bazelShardOptions->shardIndex;
                m_data.shardCount = bazelShardOptions->shardCount;
            }
        }
    }